

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_search_start(bitstream *str)

{
  uint8_t uVar1;
  vs_type vVar2;
  uint in_EAX;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uStack_28;
  uint32_t bit;
  
  if (str->dir == VS_DECODE) {
    vVar2 = str->type;
    if ((vVar2 & ~VS_H263) == VS_H261) {
      uStack_28 = (ulong)in_EAX;
      do {
        if ((str->hasbyte == 0) && (str->bytesnum <= str->bytepos)) break;
        if ((int)(0x10 - (uint)(vVar2 == VS_H261)) <= str->zero_bits) {
          return 1;
        }
        iVar3 = vs_bit(str,&bit);
      } while (iVar3 == 0);
    }
    else {
      str->hasbyte = 0;
      str->bitpos = 7;
      iVar3 = str->bytepos;
      for (lVar4 = (long)iVar3; iVar3 = iVar3 + 1, lVar4 < str->bytesnum; lVar4 = lVar4 + 1) {
        uVar1 = str->bytes[lVar4];
        if (str->zero_bytes == 2) {
          if (uVar1 != '\0') {
            iVar5 = 0;
            if (uVar1 == '\x01') {
              return 1;
            }
            goto LAB_00101f24;
          }
        }
        else {
          iVar5 = str->zero_bytes + 1;
          if (uVar1 != '\0') {
            iVar5 = 0;
          }
LAB_00101f24:
          str->zero_bytes = iVar5;
        }
        str->bytepos = iVar3;
      }
    }
    iVar3 = 0;
  }
  else {
    fwrite("vs_search_start called in encode mode!\n",0x27,1,_stderr);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int vs_search_start(struct bitstream *str) {
	if (str->dir != VS_DECODE) {
		fprintf (stderr, "vs_search_start called in encode mode!\n");
		return -1;
	}
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		uint32_t bit = 0;

		while (1) {
			if (!str->hasbyte && str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bits >= nzbit)
				return 1;
			if (vs_bit(str, &bit)) return 0;
		}
	} else {
		str->hasbyte = 0;
		str->bitpos = 7;
		while (1) {
			if (str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bytes == 2 && str->bytes[str->bytepos] == 1)
				return 1;
			if (str->bytes[str->bytepos] == 0) {
				if (str->zero_bytes != 2)
					str->zero_bytes++;
			} else {
				str->zero_bytes = 0;
			}
			str->bytepos++;
		}
	}
}